

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O1

void __thiscall QComboBox::setMaxCount(QComboBox *this,int max)

{
  long lVar1;
  long *plVar2;
  int iVar3;
  QComboBoxPrivate *d;
  long in_FS_OFFSET;
  QModelIndex local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (max < 0) {
    local_58.r = 2;
    local_58._4_8_ = 0;
    local_58._12_8_ = 0;
    local_58.m.ptr._4_4_ = 0;
    local_40 = "default";
    QMessageLogger::warning
              ((char *)&local_58,"QComboBox::setMaxCount: Invalid count (%d) must be >= 0",max);
  }
  else {
    lVar1 = *(long *)&(this->super_QWidget).field_0x8;
    plVar2 = *(long **)(lVar1 + 0x298);
    QPersistentModelIndex::operator_cast_to_QModelIndex
              (&local_58,(QPersistentModelIndex *)(lVar1 + 0x2c0));
    iVar3 = (**(code **)(*plVar2 + 0x78))(plVar2,&local_58);
    if (iVar3 - max != 0 && max <= iVar3) {
      plVar2 = *(long **)(lVar1 + 0x298);
      QPersistentModelIndex::operator_cast_to_QModelIndex
                (&local_58,(QPersistentModelIndex *)(lVar1 + 0x2c0));
      (**(code **)(*plVar2 + 0x108))(plVar2,max,iVar3 - max,&local_58);
    }
    *(int *)(lVar1 + 0x340) = max;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBox::setMaxCount(int max)
{
    Q_D(QComboBox);
    if (Q_UNLIKELY(max < 0)) {
        qWarning("QComboBox::setMaxCount: Invalid count (%d) must be >= 0", max);
        return;
    }

    const int rowCount = count();
    if (rowCount > max)
        d->model->removeRows(max, rowCount - max, d->root);

    d->maxCount = max;
}